

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrtx.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  iVar7 = 0;
  do {
    uVar3 = iVar7 + 1U >> 1;
    bVar8 = iVar7 == 0;
    iVar7 = uVar3 + 1;
  } while (bVar8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  iVar7 = 0;
  do {
    uVar3 = iVar7 + 1U >> 1;
    bVar8 = iVar7 == 0;
    iVar7 = uVar3 + 1;
  } while (bVar8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  uVar3 = 0;
  do {
    uVar4 = uVar3 + 2 >> 1;
    bVar8 = uVar3 < 2;
    uVar3 = uVar4 + 1;
  } while (bVar8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  iVar7 = 4;
  iVar5 = 0;
  do {
    iVar6 = (iVar7 + iVar5) / 2;
    iVar1 = iVar6 + 1;
    if (9 < (uint)(iVar6 * iVar6)) {
      iVar1 = iVar5;
      iVar7 = iVar6 + -1;
    }
    iVar5 = iVar1;
  } while (iVar5 <= iVar7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5 + -1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  iVar7 = 5;
  iVar5 = 0;
  do {
    iVar6 = (iVar7 + iVar5) / 2;
    iVar1 = iVar6 + 1;
    if (10 < (uint)(iVar6 * iVar6)) {
      iVar1 = iVar5;
      iVar7 = iVar6 + -1;
    }
    iVar5 = iVar1;
  } while (iVar5 <= iVar7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5 + -1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Solution solution;

	cout << solution.mySqrt(0) << endl;
	cout << solution.mySqrt(1) << endl;
	cout << solution.mySqrt(2) << endl;
	cout << solution.mySqrt(3) << endl;
	cout << solution.mySqrt(4) << endl;

	cout << solution.mySqrt(9) << endl;
	cout << solution.mySqrt(10) << endl;

	return 0;
}